

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySetDefinition::~IfcPropertySetDefinition
          (IfcPropertySetDefinition *this)

{
  code *pcVar1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcPropertyDefinition).super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3];
  pcVar1 = p_Var2 + 0x10 +
           (long)&(this->super_IfcPropertyDefinition).super_IfcRoot.Description.ptr._M_dataplus;
  *(undefined8 *)(pcVar1 + -0x70) = 0x8b3aa0;
  *(undefined8 *)(pcVar1 + 0x38) = 0x8b3ac8;
  if (*(code **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(code **)(pcVar1 + -0x10));
  }
  if (*(code **)(p_Var2 + (long)&(this->super_IfcPropertyDefinition).super_IfcRoot.Name.ptr.
                                 _M_dataplus) !=
      p_Var2 + 0x10 + (long)&(this->super_IfcPropertyDefinition).super_IfcRoot.Name.ptr._M_dataplus)
  {
    operator_delete(*(code **)(p_Var2 + (long)&(this->super_IfcPropertyDefinition).super_IfcRoot.
                                               Name.ptr._M_dataplus));
  }
  pvVar3 = *(void **)(&(this->super_IfcPropertyDefinition).super_IfcRoot.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 +
                     (long)p_Var2);
  if ((undefined1 *)pvVar3 !=
      &(this->super_IfcPropertyDefinition).super_IfcRoot.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 + (long)p_Var2) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

IfcPropertySetDefinition() : Object("IfcPropertySetDefinition") {}